

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *__format;
  int id;
  int len;
  long lVar2;
  
  len = (int)((ulong)in_RAX >> 0x20);
  clear(this);
  _id = (ulong)(uint)len << 0x20;
  iVar1 = (*dr->_vptr_DataReader[3])(dr,&id,4);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 == 4) {
    do {
      if ((long)id == -0xe9) {
        return 0;
      }
      if (id < -0x5b03) {
        _id = (ulong)(-id - 0x5b04);
        iVar1 = (*dr->_vptr_DataReader[3])(dr,&len,4);
        lVar2 = CONCAT44(extraout_var_00,iVar1);
        if (lVar2 != 4) {
          __format = "ParamDict read array length failed %zd\n";
          goto LAB_00121bab;
        }
        Mat::create(&this->params[id].v,len,4,(Allocator *)0x0);
        iVar1 = (*dr->_vptr_DataReader[3])(dr,this->params[id].v.data,(long)len << 2);
        lVar2 = CONCAT44(extraout_var_01,iVar1);
        if (lVar2 != (long)len * 4) {
          __format = "ParamDict read array element failed %zd\n";
          goto LAB_00121bab;
        }
        this->params[id].type = 4;
      }
      else {
        iVar1 = (*dr->_vptr_DataReader[3])(dr,&this->params[id].field_1,4);
        lVar2 = CONCAT44(extraout_var_02,iVar1);
        if (lVar2 != 4) {
          __format = "ParamDict read value failed %zd\n";
          goto LAB_00121bab;
        }
        this->params[id].type = 1;
      }
      iVar1 = (*dr->_vptr_DataReader[3])(dr,&id,4);
      lVar2 = CONCAT44(extraout_var_03,iVar1);
    } while (lVar2 == 4);
    __format = "ParamDict read EOP failed %zd\n";
  }
  else {
    __format = "ParamDict read id failed %zd\n";
  }
LAB_00121bab:
  fprintf(_stderr,__format,lVar2);
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    size_t nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != sizeof(int))
    {
        fprintf(stderr, "ParamDict read id failed %zd\n", nread);
        return -1;
    }

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                fprintf(stderr, "ParamDict read array length failed %zd\n", nread);
                return -1;
            }

            params[id].v.create(len);

            float* ptr = params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != sizeof(float) * len)
            {
                fprintf(stderr, "ParamDict read array element failed %zd\n", nread);
                return -1;
            }

            params[id].type = 4;
        }
        else
        {
            nread = dr.read(&params[id].f, sizeof(float));
            if (nread != sizeof(float))
            {
                fprintf(stderr, "ParamDict read value failed %zd\n", nread);
                return -1;
            }

            params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != sizeof(int))
        {
            fprintf(stderr, "ParamDict read EOP failed %zd\n", nread);
            return -1;
        }
    }

    return 0;
}